

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  TreeNode<ObservationHistory> *this_00;
  size_t sVar1;
  size_t sVar2;
  ObservationHistoryTree *pOVar3;
  size_type sVar4;
  reference ppOVar5;
  ObservationHistory *this_01;
  size_t sVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  void *pvVar10;
  reference pvVar11;
  size_type sVar12;
  uint in_ESI;
  PlanningUnit *in_RDI;
  TreeNode<ObservationHistory> *unaff_retaddr;
  LIndex in_stack_00000008;
  TreeNode<ObservationHistory> *in_stack_00000010;
  size_t length;
  size_t nrObsHist;
  Index nr_OHI_for_ts;
  Index obsI;
  Index nr_OHI_for_ts_1;
  size_t thisLength;
  ObservationHistoryTree *oht;
  Index ts;
  ObservationHistoryTree *root;
  ObservationHistory *oh;
  ObservationHistoryTree *next_oht;
  ObservationHistory *next_oh;
  size_t nrO;
  Index maxLength;
  Index ObservationHistoryIndex;
  queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
  ohtQueue;
  undefined4 in_stack_fffffffffffffdf8;
  Index in_stack_fffffffffffffdfc;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  ObservationHistory *in_stack_fffffffffffffe10;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe18;
  ObservationHistory *in_stack_fffffffffffffe20;
  uint local_dc;
  uint local_a4;
  uint local_64;
  
  std::
  queue<ObservationHistoryTree*,std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>>
  ::queue<std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>,void>
            ((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
              *)in_stack_fffffffffffffe00);
  local_64 = 0;
  sVar1 = PlanningUnit::GetHorizon(in_RDI);
  sVar2 = GetNrObservations(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  operator_new(0x30);
  ObservationHistory::ObservationHistory
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (Index)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  pOVar3 = (ObservationHistoryTree *)operator_new(0x58);
  ObservationHistoryTree::ObservationHistoryTree
            ((ObservationHistoryTree *)in_stack_fffffffffffffe00,
             (ObservationHistory *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::
  queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
  ::push((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
          *)in_stack_fffffffffffffe00,
         (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_a4 = 0;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)&in_RDI[3]._m_seed,(ulong)in_ESI);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffe00,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  while (sVar4 = std::
                 queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
                 ::size((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
                         *)0x9d3c68), sVar4 != 0) {
    ppOVar5 = std::
              queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
              ::front((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
                       *)0x9d3c91);
    this_00 = &(*ppOVar5)->super_TreeNode<ObservationHistory>;
    TreeNode<ObservationHistory>::SetIndex(this_00,(ulong)local_64);
    std::
    vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
    ::operator[]((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                  *)(in_RDI + 0xc),(ulong)in_ESI);
    std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::push_back
              ((vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_> *)
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    this_01 = TreeNode<ObservationHistory>::GetContainedElement(this_00);
    sVar6 = History::GetLength((History *)this_01);
    if (local_a4 != (uint)sVar6) {
      pvVar7 = std::
               vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                             *)&in_RDI[3]._m_seed,(ulong)in_ESI);
      pvVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (pvVar7,(ulong)local_a4);
      Globals::CastLIndexToIndex(*pvVar8);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&in_RDI[2]._m_horizon,(ulong)in_ESI);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      local_a4 = local_a4 + 1;
      if (local_a4 != (uint)sVar6) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "ERROR: CreateObservationHistories:  ++ts != ");
        poVar9 = std::operator<<(poVar9,"(Index) thisLength !!! ts (now) is: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_a4);
        poVar9 = std::operator<<(poVar9,"thisLength =");
        pvVar10 = (void *)std::ostream::operator<<(poVar9,sVar6);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                    *)&in_RDI[3]._m_seed,(ulong)in_ESI);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 in_stack_fffffffffffffe00,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    local_64 = local_64 + 1;
    if (sVar6 < (int)sVar1 - 1) {
      for (local_dc = 0; local_dc < sVar2; local_dc = local_dc + 1) {
        operator_new(0x30);
        ObservationHistoryTree::GetObservationHistory((ObservationHistoryTree *)0x9d3fdc);
        ObservationHistory::ObservationHistory
                  (in_stack_fffffffffffffe20,(Index)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   in_stack_fffffffffffffe10);
        operator_new(0x58);
        ObservationHistoryTree::ObservationHistoryTree
                  ((ObservationHistoryTree *)in_stack_fffffffffffffe00,
                   (ObservationHistory *)
                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        TreeNode<ObservationHistory>::SetSuccessor
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr);
        std::
        queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
        ::push((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
                *)in_stack_fffffffffffffe00,
               (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      }
    }
    std::
    queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
    ::pop((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
           *)0x9d40f4);
  }
  pvVar7 = std::
           vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                         *)&in_RDI[3]._m_seed,(ulong)in_ESI);
  pvVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (pvVar7,(ulong)local_a4);
  Globals::CastLIndexToIndex(*pvVar8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&in_RDI[2]._m_horizon,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  PlanningUnit::GetHorizon(in_RDI);
  sVar1 = IndexTools::CalculateNumberOfSequences
                    ((size_t)in_stack_fffffffffffffe00,
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (local_64 == sVar1) {
    pvVar11 = std::
              vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
              ::operator[]((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                            *)(in_RDI + 0xc),(ulong)in_ESI);
    sVar12 = std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::size
                       (pvVar11);
    if (sVar1 == sVar12) goto LAB_009d4328;
  }
  poVar9 = std::operator<<((ostream *)&std::cerr," WARNING:ObservationHistoryIndex=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_64);
  poVar9 = std::operator<<(poVar9," nrObsHist=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar1);
  poVar9 = std::operator<<(poVar9," _m_observationHistoryTreeVectors[agentI=");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,in_ESI);
  poVar9 = std::operator<<(poVar9,"].size()=");
  pvVar11 = std::
            vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
            ::operator[]((vector<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                          *)(in_RDI + 0xc),(ulong)in_ESI);
  sVar12 = std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::size
                     (pvVar11);
  pvVar10 = (void *)std::ostream::operator<<(poVar9,sVar12);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
LAB_009d4328:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe00,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::
  queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
  ::~queue((queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
            *)0x9d436c);
  return pOVar3;
}

Assistant:

ObservationHistoryTree*
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(Index agentI)
{
    //we want to number the Observation Histories breadth-first, so we 
    //use a queue:
    queue<ObservationHistoryTree*> ohtQueue;
    
    Index ObservationHistoryIndex = 0;
    Index maxLength = GetHorizon()-1;//max. observation hist length = h-1
    size_t nrO = GetNrObservations(agentI);
    ObservationHistory* next_oh = 0;
    ObservationHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) observation history

    ObservationHistory* oh = new ObservationHistory(*this, agentI);
    ObservationHistoryTree* root = new ObservationHistoryTree(oh);//, nrO);
    ohtQueue.push(root);

    Index ts = 0;
    _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ObservationHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ObservationHistoryIndex);
        _m_observationHistoryTreeVectors[agentI].push_back(oht);

        size_t thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength) //length 1 <-> ts 1 
        {
            // we've now started processing OHs for the next ts
            Index nr_OHI_for_ts = ObservationHistoryIndex - 
                CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
            cout << "First oh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
                ObservationHistoryIndex << endl;
            Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
            _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts); 
#if DEBUG_PUDCOHT
            cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_OHI_for_ts << endl;
#endif
            if(++ts != (Index) thisLength )
                cout << "ERROR: CreateObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength =" << thisLength <<endl;
            _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);            
        }
        
        ObservationHistoryIndex++; //index of an Observation HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = observation index
            {
                next_oh = new ObservationHistory(obsI, 
                    oht->GetObservationHistory());
                next_oht = new ObservationHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    

    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_OHI_for_ts = (ObservationHistoryIndex) 
        - CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
    cout << "Last ts end: store nr of ts=h-1 OH..."<<endl<<
        "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
        ObservationHistoryIndex << endl;
    Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
    _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts);
#if DEBUG_PUDCOHT
    cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_OHI_for_ts<<endl;
#endif
    //in a horizon h MADP without initial observation, the max. observation 
    //sequence length is h-1 observations (and the minimum is 0).
    size_t nrObsHist;
    size_t length = GetHorizon() - 1; // = maxLength - 1
    nrObsHist = IndexTools::CalculateNumberOfSequences(nrO, length);

    if( ObservationHistoryIndex != nrObsHist || 
        nrObsHist != _m_observationHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ObservationHistoryIndex="<< ObservationHistoryIndex <<
        " nrObsHist=" << nrObsHist <<" _m_observationHistoryTreeVectors[agentI="
        << agentI<<"].size()=" << _m_observationHistoryTreeVectors[agentI].size()
        << endl;
    
    _m_nrObservationHistories.push_back(ObservationHistoryIndex);

    return(root);
}